

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

void isobusfs_send_nack(int sock,isobusfs_msg *msg)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 *in_RSI;
  int in_EDI;
  int ret;
  isobusfs_nack nack;
  sockaddr_can addr;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 auStack_2e [2];
  undefined1 local_2c;
  undefined2 local_2b;
  undefined1 local_29;
  sockaddr local_28;
  undefined8 local_18;
  int local_4;
  
  local_28._0_8_ = *(undefined8 *)(in_RSI + 0x10010);
  local_28.sa_data._6_8_ = *(undefined8 *)(in_RSI + 0x10018);
  local_18 = *(undefined8 *)(in_RSI + 0x10020);
  local_30 = 1;
  local_2f = *in_RSI;
  local_4 = in_EDI;
  memset(auStack_2e,0xff,2);
  local_2c = local_18._4_1_;
  local_2b = (undefined2)local_18;
  local_29 = local_18._2_1_;
  local_18 = CONCAT44(local_18._4_4_,0xe800);
  sVar2 = sendto(local_4,&local_30,8,0x40,&local_28,0x18);
  if ((int)sVar2 < 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    pcVar4 = strerror(-iVar1);
    isobusfs_log(LOG_LEVEL_WARN,"failed to send NACK: %i (%s)",(ulong)(uint)-iVar1,pcVar4);
  }
  isobusfs_log(LOG_LEVEL_DEBUG,"send NACK");
  return;
}

Assistant:

void isobusfs_send_nack(int sock, struct isobusfs_msg *msg)
{
	struct sockaddr_can addr = msg->peername;
	struct isobusfs_nack nack;
	int ret;

	nack.ctrl = ISOBUS_ACK_CTRL_NACK;
	nack.group_function = msg->buf[0];
	memset(&nack.reserved[0], 0xff, sizeof(nack.reserved));
	nack.address_nack = addr.can_addr.j1939.addr;
	memcpy(&nack.pgn_nack[0], &addr.can_addr.j1939.pgn,
		sizeof(nack.pgn_nack));

	addr.can_addr.j1939.pgn = ISOBUS_PGN_ACK;
	ret = sendto(sock, &nack, sizeof(nack), MSG_DONTWAIT,
			  (struct sockaddr *)&addr,
			   sizeof(addr));
	if (ret < 0) {
		ret = -errno;
		pr_warn("failed to send NACK: %i (%s)", ret, strerror(ret));
	}

	pr_debug("send NACK");
}